

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [39];
  byte local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [32];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  byte local_11e;
  byte local_11d;
  byte local_109;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_108;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  long local_20;
  size_type pos;
  text *arg_local;
  
  pos = (size_type)arg;
  arg_local = (text *)__return_storage_ptr__;
  local_20 = std::__cxx11::string::rfind((char)arg,0x3d);
  local_109 = 0;
  local_11d = 0;
  local_11e = 0;
  local_181 = 0;
  bVar1 = local_20 != -1;
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_180,(ulong)arg);
    local_181 = 1;
    std::__cxx11::string::substr((ulong)local_1a8,(ulong)arg);
    std::make_tuple<std::__cxx11::string,std::__cxx11::string>(&local_160,local_180,local_1a8);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::tuple(&local_60,&local_160);
  }
  else {
    std::make_tuple<std::__cxx11::string&,char_const(&)[1]>(&local_108,arg,(char (*) [1])0x1fb2b7);
    local_109 = 1;
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_true>
              (&local_e0,&local_108);
    local_11d = 1;
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::tuple(&local_a0,&local_e0);
    local_11e = 1;
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::tuple(&local_60,&local_a0);
  }
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::tuple(__return_storage_ptr__,&local_60);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple(&local_60);
  if (bVar1) {
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple(&local_160);
    std::__cxx11::string::~string((string *)local_1a8);
  }
  if ((local_181 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_180);
  }
  if ((local_11e & 1) != 0) {
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple(&local_a0);
  }
  if ((local_11d & 1) != 0) {
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple(&local_e0);
  }
  if ((local_109 & 1) != 0) {
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
    ::~tuple(&local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto split_option( text arg ) -> std::tuple<text, text>
{
    auto pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_tuple( arg, "" )
                : std::make_tuple( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}